

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ForRangeStmt * __thiscall parser::Parser::parseForIntRangeStatement(Parser *this)

{
  bool bVar1;
  ForRangeStmt *this_00;
  Identifier *this_01;
  RangeExpr *pRVar2;
  BlockStmt *pBVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  Token local_1f0;
  Token local_1c0;
  ostringstream message;
  
  this_00 = (ForRangeStmt *)operator_new(0x58);
  token::Token::Token(&local_1c0,&this->curToken);
  ast::ForRangeStmt::ForRangeStmt(this_00,&local_1c0,this->l->line);
  token::Token::~Token(&local_1c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&message);
  bVar1 = expectPeek(this,ID);
  if (bVar1) {
    this_01 = (Identifier *)operator_new(0x48);
    token::Token::Token(&local_1f0,&this->curToken);
    ast::Identifier::Identifier(this_01,&local_1f0,this->l->line);
    this_00->target = this_01;
    token::Token::~Token(&local_1f0);
    bVar1 = expectPeek(this,IN);
    if (bVar1) {
      pRVar2 = parseIntRangeExpression(this);
      this_00->iter = pRVar2;
      pBVar3 = parseBlockStatement(this);
      this_00->body = pBVar3;
      nextToken(this);
      goto LAB_0010efbc;
    }
    poVar4 = std::operator<<((ostream *)&message,"expected \'in\'");
    poVar4 = std::operator<<(poVar4," found ");
    std::operator<<(poVar4,(string *)&(this->peekToken).Literal);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors,
               &local_210);
  }
  else {
    poVar4 = std::operator<<((ostream *)&message,"expected an identifier");
    poVar4 = std::operator<<(poVar4," found ");
    std::operator<<(poVar4,(string *)&(this->peekToken).Literal);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors,
               &local_210);
  }
  std::__cxx11::string::~string((string *)&local_210);
  (*(this_00->super_Stmt).super_Node._vptr_Node[1])(this_00);
  this_00 = (ForRangeStmt *)0x0;
LAB_0010efbc:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message);
  return this_00;
}

Assistant:

ForRangeStmt* Parser::parseForIntRangeStatement()
{
    ForRangeStmt* stmt(new ForRangeStmt(curToken, l->line));
    std::ostringstream message;
    if(!expectPeek(TokenType::ID)){
        message << "expected an identifier"
             << " found " << peekToken.Literal;
        errors.push_back(message.str());
        delete stmt;
        return nullptr;
    }

    stmt->target = new Identifier(curToken, l->line);
    if(!expectPeek(TokenType::IN)){
        message << "expected 'in'"
             << " found " << peekToken.Literal;
        errors.push_back(message.str());
        delete stmt;
        return nullptr;
    }
    stmt->iter = parseIntRangeExpression();
    stmt->body = parseBlockStatement();
    nextToken();
    return stmt;
}